

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O1

int compArgStr(char *str,char *arg,int min)

{
  uint uVar1;
  __int32_t _Var2;
  __int32_t *p_Var3;
  size_t sVar4;
  __int32_t **pp_Var5;
  ushort **ppuVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  
  sVar9 = 0;
  if (arg != (char *)0x0 && str != (char *)0x0) {
    sVar4 = strlen(arg);
    if (0 < (int)(uint)sVar4) {
      pp_Var5 = __ctype_toupper_loc();
      p_Var3 = *pp_Var5;
      sVar8 = 0;
      do {
        sVar9 = sVar8;
        uVar1 = p_Var3[str[sVar9]];
        _Var2 = p_Var3[arg[sVar9]];
        if ((long)min <= (long)sVar9) {
          iVar7 = uVar1 * 0x1000000;
          if (iVar7 < 0x2d000000) {
            if (((uVar1 & 0xff) == 0) || (iVar7 == 0x2b000000)) break;
          }
          else if ((iVar7 == 0x2d000000) || (iVar7 == 0x2e000000)) break;
          ppuVar6 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar6 + (long)(iVar7 >> 0x18) * 2 + 1) & 8) != 0) break;
        }
        if ((char)_Var2 != (char)uVar1) {
          sVar9 = 0;
          break;
        }
        sVar8 = sVar9 + 1;
        sVar9 = sVar4;
      } while (((uint)sVar4 & 0x7fffffff) != sVar8);
    }
  }
  return (int)sVar9;
}

Assistant:

int compArgStr(char *str, char *arg, int min) {
   int i, max;
   char s, a;

   if (!str || !arg) return 0;

   max = strlen(arg);

   for(i=0; i<max; i++) {
      s = toupper(str[i]);
      a = toupper(arg[i]);

      if (i >= min && (s == '\0' || s == '.'
	 || s == '+' || s == '-' || isdigit(s))) {
	 break; /* good ending point */
      }
      else if (s != a) {
	 i = 0; /* failed to match */
	 break;
      }
   }

   return i;
}